

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O0

re_state_id __thiscall CRegexParser::alloc_state(CRegexParser *this)

{
  void *pvVar1;
  int iVar2;
  int *in_RDI;
  int new_alloc;
  
  if (in_RDI[4] <= *in_RDI) {
    iVar2 = in_RDI[4] + 100;
    if (in_RDI[4] == 0) {
      pvVar1 = malloc((long)iVar2 * 0x28);
      *(void **)(in_RDI + 2) = pvVar1;
    }
    else {
      pvVar1 = realloc(*(void **)(in_RDI + 2),(long)iVar2 * 0x28);
      *(void **)(in_RDI + 2) = pvVar1;
    }
    in_RDI[4] = iVar2;
  }
  *(undefined4 *)(*(long *)(in_RDI + 2) + (long)*in_RDI * 0x28 + 0x18) = 0xffffffff;
  *(undefined4 *)(*(long *)(in_RDI + 2) + (long)*in_RDI * 0x28 + 0x1c) = 0xffffffff;
  *(undefined4 *)(*(long *)(in_RDI + 2) + (long)*in_RDI * 0x28 + 8) = 4;
  *(undefined1 *)(*(long *)(in_RDI + 2) + (long)*in_RDI * 0x28 + 0x20) = 0;
  *(undefined4 *)(*(long *)(in_RDI + 2) + (long)*in_RDI * 0x28) = 0;
  iVar2 = *in_RDI;
  *in_RDI = iVar2 + 1;
  return iVar2;
}

Assistant:

re_state_id CRegexParser::alloc_state()
{
    /*
     *   If we don't have enough room for another state, expand the array 
     */
    if (next_state_ >= tuples_alloc_)
    {
        int new_alloc;
        
        /* bump the size by a bit */
        new_alloc = tuples_alloc_ + 100;
        
        /* allocate or expand the array */
        if (tuples_alloc_ == 0)
        {
            /* allocate the initial memory block */
            tuple_arr_ = (re_tuple *)t3malloc(new_alloc * sizeof(re_tuple));
        }
        else
        {
            /* re-allocate the existing memory block */
            tuple_arr_ = (re_tuple *)t3realloc(tuple_arr_,
                                               new_alloc * sizeof(re_tuple));
        }

        /* remember the new allocation size */
        tuples_alloc_ = new_alloc;
    }

    /* initialize the next state */
    tuple_arr_[next_state_].next_state_1 = RE_STATE_INVALID;
    tuple_arr_[next_state_].next_state_2 = RE_STATE_INVALID;
    tuple_arr_[next_state_].info.ch = RE_EPSILON;
    tuple_arr_[next_state_].flags = 0;
    tuple_arr_[next_state_].typ = RE_INVALID;

    /* return the new state's ID */
    return next_state_++;
}